

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewExprEnd(LocationUpdater *this,BinaryLocation oldAddr)

{
  ulong uVar1;
  BinaryLocation BVar2;
  Expression *pEVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  pEVar3 = AddrExprMap::getEnd(&this->oldExprAddrMap,oldAddr);
  if (pEVar3 == (Expression *)0x0) {
    BVar2 = 0;
  }
  else {
    uVar1 = (this->newLocations->expressions)._M_h._M_bucket_count;
    uVar5 = (ulong)pEVar3 % uVar1;
    p_Var6 = (this->newLocations->expressions)._M_h._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var6->_M_nxt, p_Var7 = p_Var6, pEVar3 != (Expression *)p_Var6->_M_nxt[1]._M_nxt))
    {
      while (p_Var6 = p_Var4, p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var7 = p_Var6, pEVar3 == (Expression *)p_Var4[1]._M_nxt)) goto LAB_00c9046f;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00c9046f:
    BVar2 = 0;
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var7->_M_nxt;
    }
    if (p_Var4 != (_Hash_node_base *)0x0) {
      BVar2 = *(BinaryLocation *)((long)&p_Var4[2]._M_nxt + 4);
    }
  }
  return BVar2;
}

Assistant:

BinaryLocation getNewExprEnd(BinaryLocation oldAddr) const {
    if (auto* expr = oldExprAddrMap.getEnd(oldAddr)) {
      auto iter = newLocations.expressions.find(expr);
      if (iter != newLocations.expressions.end()) {
        return iter->second.end;
      }
    }
    return 0;
  }